

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolortransform.cpp
# Opt level: O0

void __thiscall
QColorTransformPrivate::apply<unsigned_int,unsigned_int>
          (QColorTransformPrivate *this,uint *dst,uint *src,qsizetype count,TransformFlags flags)

{
  long lVar1;
  bool bVar2;
  QColorSpacePrivate *pQVar3;
  longlong *plVar4;
  QColorTransformPrivate *in_RCX;
  long in_RDX;
  long in_RSI;
  QColorTransformPrivate *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  qsizetype len;
  qsizetype i;
  QUninitialized<QColorVector,_256> buffer;
  long in_stack_ffffffffffffef98;
  QColorVector *in_stack_ffffffffffffefa0;
  uint *src_00;
  QColorTransformPrivate *in_stack_ffffffffffffefb8;
  uint *dst_00;
  undefined4 in_stack_ffffffffffffefe0;
  QFlagsStorage<QColorTransformPrivate::TransformFlag> flags_00;
  QUninitialized local_1008 [8];
  QColorVector *in_stack_fffffffffffff000;
  QFlagsStorage<QColorTransformPrivate::TransformFlag> in_stack_fffffffffffff00c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QExplicitlySharedDataPointer<const_QColorSpacePrivate>::operator->
                     ((QExplicitlySharedDataPointer<const_QColorSpacePrivate> *)0x4d64a8);
  bVar2 = QColorSpacePrivate::isThreeComponentMatrix(pQVar3);
  if (bVar2) {
    updateLutsIn(in_stack_ffffffffffffefb8);
  }
  pQVar3 = QExplicitlySharedDataPointer<const_QColorSpacePrivate>::operator->
                     ((QExplicitlySharedDataPointer<const_QColorSpacePrivate> *)0x4d64ce);
  bVar2 = QColorSpacePrivate::isThreeComponentMatrix(pQVar3);
  if (bVar2) {
    updateLutsOut(in_stack_ffffffffffffefb8);
  }
  for (dst_00 = (uint *)0x0; (long)dst_00 < (long)in_RCX;
      dst_00 = (uint *)((long)src_00 + (long)dst_00)) {
    flags_00.i = (Int)((ulong)((long)in_RCX - (long)dst_00) >> 0x20);
    plVar4 = qMin<long_long>((longlong *)&stack0xffffffffffffefe8,&WorkBlockSize);
    src_00 = (uint *)*plVar4;
    QUninitialized::operator_cast_to_QColorVector_(local_1008);
    applyConvertIn<unsigned_int>
              (in_RDI,(uint *)in_stack_ffffffffffffefa0,
               (QColorVector *)CONCAT44(in_R8D,in_stack_ffffffffffffefe0),in_stack_ffffffffffffef98,
               (TransformFlags)flags_00.i);
    QUninitialized::operator_cast_to_QColorVector_(local_1008);
    pcsAdapt(in_RDI,in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
    in_stack_ffffffffffffef98 = in_RSI + (long)dst_00 * 4;
    in_stack_ffffffffffffefa0 = (QColorVector *)(in_RDX + (long)dst_00 * 4);
    QUninitialized::operator_cast_to_QColorVector_(local_1008);
    in_stack_ffffffffffffefe0 = in_R8D;
    applyConvertOut<unsigned_int,unsigned_int>
              (in_RCX,dst_00,src_00,in_stack_fffffffffffff000,(qsizetype)in_RDI,
               (TransformFlags)in_stack_fffffffffffff00c.i);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColorTransformPrivate::apply(D *dst, const S *src, qsizetype count, TransformFlags flags) const
{
    if (colorSpaceIn->isThreeComponentMatrix())
        updateLutsIn();
    if (colorSpaceOut->isThreeComponentMatrix())
        updateLutsOut();

    Q_DECL_UNINITIALIZED QUninitialized<QColorVector, WorkBlockSize> buffer;
    qsizetype i = 0;
    while (i < count) {
        const qsizetype len = qMin(count - i, WorkBlockSize);

        applyConvertIn(src + i, buffer, len, flags);

        pcsAdapt(buffer, len);

        applyConvertOut(dst + i, src + i, buffer, len, flags);

        i += len;
    }
}